

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

lws_parser_return_t lws_parse(lws *wsi,uchar *buf,int *len)

{
  uint16_t *puVar1;
  ah_data_idx_t aVar2;
  allocated_headers *paVar3;
  allocated_headers *paVar4;
  lws_fragments *plVar5;
  byte bVar6;
  uint8_t uVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  uint32_t u32;
  int iVar15;
  uint uVar16;
  uchar c;
  char dotstar [64];
  byte local_85;
  uint local_84;
  lws_context *local_80;
  char local_78 [72];
  
  paVar3 = (wsi->http).ah;
  if (paVar3 == (allocated_headers *)0x0) {
    __assert_fail("wsi->http.ah",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x3e4,"lws_parser_return_t lws_parse(struct lws *, unsigned char *, int *)");
  }
  local_80 = (wsi->a).context;
  iVar10 = *len;
LAB_0011d0e4:
  *len = iVar10 + -1;
  bVar8 = *buf;
  bVar6 = paVar3->parser_state;
  uVar14 = (uint)bVar8;
  local_85 = bVar8;
  if (4 < bVar6 - 0x61) {
    _lws_log(0x20,"WSI_TOK_(%d) \'%c\'\n",(ulong)bVar6,(ulong)uVar14);
    bVar6 = paVar3->parser_state;
    if (paVar3->frags[paVar3->frag_index[bVar6]].len != 0 || bVar8 != 0x20) {
      lVar13 = 0;
      do {
        if (bVar6 == ""[lVar13]) {
          if (bVar8 == 0x20) {
            if ((paVar3->frags[paVar3->nfrag].len == 0) &&
               (iVar10 = issue_char(wsi,'/'), iVar10 < 0)) {
              return LPR_FAIL;
            }
            if (paVar3->ups != '\x03') goto LAB_0011d5e8;
            bVar8 = paVar3->nfrag;
            uVar9 = paVar3->frags[bVar8].len;
            if (uVar9 < 3) goto LAB_0011d5e8;
            aVar2 = paVar3->pos;
            paVar3->frags[bVar8].len = uVar9 - 1;
            uVar9 = uVar9 - 2;
            uVar14 = aVar2 - 2;
            goto LAB_0011d5c7;
          }
          iVar10 = lws_parse_urldecode(wsi,&local_85);
          switch(iVar10) {
          case 0:
            bVar6 = paVar3->parser_state;
            break;
          case 1:
            uVar7 = paVar3->parser_state;
            goto LAB_0011d6a1;
          case 2:
            goto switchD_0011d64a_caseD_2;
          case 3:
            bVar8 = paVar3->nfrag;
            goto LAB_0011d6b4;
          default:
            return LPR_FAIL;
          }
          break;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      bVar8 = local_85;
      if ((bVar6 != 8) && ((local_85 == 0xd || (local_85 == 10)))) {
        if (paVar3->ues != '\0') goto switchD_0011d64a_caseD_2;
        uVar7 = 'd';
        if (local_85 == 10) {
          paVar3->unk_pos = 0;
          paVar3->lextable_pos = 0;
          uVar7 = 'a';
        }
        paVar3->parser_state = uVar7;
        local_85 = 0;
        bVar8 = 0;
        _lws_log(0x20,"*\n");
      }
      iVar10 = issue_char(wsi,bVar8);
      if (iVar10 < 0) {
        return LPR_FAIL;
      }
      if (iVar10 == 0) {
        uVar7 = paVar3->parser_state;
        if (bVar8 == 0) {
          if (uVar7 == 'L') goto LAB_0011d827;
          paVar4 = (wsi->http).ah;
          puVar1 = &paVar4->frags[paVar4->nfrag].len;
          *puVar1 = *puVar1 - 1;
        }
LAB_0011d6a1:
        if (uVar7 == '\b') goto LAB_0011d876;
      }
      else {
LAB_0011d820:
        paVar3->parser_state = 'c';
      }
    }
    goto LAB_0011d827;
  }
  uVar16 = (uint)bVar8;
  switch((uint)bVar6) {
  case 0x61:
    _lws_log(0x20,"WSI_TOKEN_NAME_PART \'%c\' 0x%02X (role=0x%lx) wsi->lextable_pos=%d\n",
             (ulong)uVar16,(ulong)uVar16,(ulong)*(ushort *)((long)&wsi->wsistate + 2) << 0x10,
             (ulong)(uint)(int)paVar3->lextable_pos);
    if (paVar3->unk_pos == 0 && bVar8 == 10) {
LAB_0011d876:
      if (paVar3->ues == '\0') {
        paVar4 = (wsi->http).ah;
        if ((paVar4 != (allocated_headers *)0x0) && (bVar8 = paVar4->frag_index[5], bVar8 != 0)) {
          iVar10 = 0;
          do {
            iVar15 = (uint)paVar4->frags[bVar8].len + iVar10;
            bVar8 = paVar4->frags[bVar8].nfrag;
            iVar10 = (uint)(bVar8 != 0) + iVar15;
          } while (bVar8 != 0);
          if (iVar15 != 0) {
            if (((ulong)paVar4->frag_index[0x21] != 0) && (paVar4->data != (char *)0x0)) {
              iVar10 = atoi(paVar4->data + paVar4->frags[paVar4->frag_index[0x21]].offset);
              wsi->rx_frame_type = (char)iVar10;
            }
            _lws_log(0x20,"v%02d hdrs done\n",(ulong)(uint)(int)wsi->rx_frame_type);
          }
        }
        paVar3->parser_state = 'e';
        wsi->field_0x46e = wsi->field_0x46e | 1;
        return LPR_OK;
      }
switchD_0011d64a_caseD_2:
      _lws_log(8," forbidding on uri sanitation\n");
      lws_return_http_status(wsi,0x193,(char *)0x0);
      return LPR_FORBIDDEN;
    }
    if ((byte)(bVar8 + 0xbf) < 0x1a) {
      bVar8 = bVar8 | 0x20;
      local_85 = bVar8;
    }
    if ((paVar3->unk_pos == 0) && ((*(ulong *)&wsi->field_0x46e & 2) == 0)) {
      paVar3->unk_pos = paVar3->pos;
      iVar10 = 8;
      do {
        iVar15 = lws_pos_in_bounds(wsi);
        if (iVar15 == 0) {
          uVar14 = paVar3->pos;
          paVar3->pos = uVar14 + 1;
          paVar3->data[uVar14] = '\0';
        }
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    iVar10 = lws_pos_in_bounds(wsi);
    if (iVar10 != 0) {
      return LPR_FAIL;
    }
    uVar14 = paVar3->pos;
    paVar3->pos = uVar14 + 1;
    paVar3->data[uVar14] = bVar8;
    uVar9 = paVar3->lextable_pos;
    if ((((*(ulong *)&wsi->field_0x46e & 2) == 0) && ((short)uVar9 < 0)) && (bVar8 == 0x3a)) {
      u32 = paVar3->unk_pos;
      if (paVar3->unk_ll_head == 0) {
        paVar3->unk_ll_head = u32;
      }
      if (paVar3->unk_ll_tail != 0) {
        lws_ser_wu32be((uint8_t *)(paVar3->data + (paVar3->unk_ll_tail + 4)),u32);
        u32 = paVar3->unk_pos;
      }
      paVar3->unk_ll_tail = u32;
      uVar14 = (paVar3->pos - u32) - 7;
      if (0x3f < uVar14) {
        uVar14 = 0x40;
      }
      lws_strncpy(local_78,paVar3->data + (u32 + 8),(ulong)uVar14);
      _lws_log(0x10,"%s: unk header %d \'%s\'\n","lws_parse",
               (ulong)((paVar3->pos - paVar3->unk_pos) - 8),local_78);
      lws_ser_wu16be((uint8_t *)(paVar3->data + paVar3->unk_pos),
                     ((short)paVar3->pos - (short)paVar3->unk_pos) - 8);
      paVar3->unk_value_pos = paVar3->pos;
      paVar3->parser_state = 'b';
      break;
    }
    if ((short)uVar9 < 0) break;
    uVar14 = (uint)uVar9;
    bVar6 = "g@"[uVar9];
    if (-1 < (char)bVar6) {
      uVar11 = (ulong)uVar9 + 1;
      do {
        if (bVar6 == 8) goto LAB_0011d502;
        if (bVar6 < 8) {
          if ((*(ulong *)&wsi->field_0x46e & 2) == 0) {
            paVar3->pos = paVar3->unk_pos;
            paVar3->unk_pos = 0;
          }
          uVar9 = (short)uVar11 - 1;
          goto LAB_0011d728;
        }
        if (bVar6 == bVar8) {
          uVar9 = ((short)uVar11 + CONCAT11("g@"[(int)uVar11 + 1],"g@"[uVar11 & 0xffffffff])) - 1;
          goto LAB_0011d728;
        }
        bVar6 = "g@"[uVar11 + 2];
        uVar11 = uVar11 + 3;
      } while (-1 < (char)bVar6);
      uVar14 = (int)uVar11 - 1;
    }
    if (((bVar6 & 0x7f) != bVar8) || ("g@"[(ulong)uVar14 + 1] == '\b')) {
LAB_0011d502:
      paVar3->lextable_pos = -1;
LAB_0011d7fe:
      if ((wsi->role_ops == &role_ops_h1) && ((wsi->wsistate & 0x20000000) != 0)) {
        lVar13 = 0;
        while (paVar3->frag_index[""[lVar13]] == '\0') {
          lVar13 = lVar13 + 1;
          if (lVar13 == 8) {
            if ((((wsi->a).vhost)->options & 0x100000) != 0) {
              _lws_log(4,"%s: http fail fallback\n","lws_parse");
              return LPR_DO_FALLBACK;
            }
            _lws_log(8,"Unknown method - dropping\n");
            goto switchD_0011d64a_caseD_2;
          }
        }
      }
      if ((wsi->field_0x46e & 2) != 0) goto LAB_0011d820;
      break;
    }
    uVar9 = (short)uVar14 + 1;
LAB_0011d728:
    paVar3->lextable_pos = uVar9;
    if ((short)uVar9 < 0) goto LAB_0011d7fe;
    if (7 < "g@"[uVar9]) break;
    local_84 = (uint)"g@"[(ulong)uVar9 + 1];
    uVar14 = (uint)CONCAT11("g@"[uVar9],"g@"[(ulong)uVar9 + 1]);
    _lws_log(0x20,"known hdr %d\n",(ulong)uVar14);
    lVar13 = 0;
    do {
      if ((uVar14 == ""[lVar13]) && (paVar3->frag_index[""[lVar13]] != '\0')) {
        _lws_log(2,"Duplicated method\n");
        return LPR_FAIL;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    if ((wsi->field_0x46e & 2) == 0) {
      paVar3->pos = paVar3->unk_pos;
      paVar3->unk_pos = 0;
    }
    bVar8 = (byte)local_84;
    if (uVar14 == 0x22) {
      bVar8 = 6;
    }
    paVar3->parser_state = bVar8;
    paVar3->ups = '\0';
    if (local_80->token_limits == (lws_token_limits *)0x0) {
      uVar14 = ((wsi->a).context)->max_http_header_data;
    }
    else {
      uVar14 = (uint)local_80->token_limits->token_limit[bVar8];
    }
    paVar3->current_token_limit = uVar14;
    if (bVar8 == 8) goto LAB_0011d876;
    goto LAB_0011d611;
  case 0x62:
    if (uVar16 != 0xd) {
      if (uVar16 == 10) {
        lws_ser_wu16be((uint8_t *)(paVar3->data + (paVar3->unk_pos + 2)),
                       (short)paVar3->pos - (short)paVar3->unk_value_pos);
        goto LAB_0011d381;
      }
      if ((paVar3->pos != paVar3->unk_value_pos) || ((uVar16 != 9 && (uVar16 != 0x20)))) {
        iVar10 = lws_pos_in_bounds(wsi);
        if (iVar10 != 0) {
          return LPR_FAIL;
        }
        uVar14 = paVar3->pos;
        paVar3->pos = uVar14 + 1;
        paVar3->data[uVar14] = bVar8;
      }
    }
    break;
  case 99:
    _lws_log(0x20,"WSI_TOKEN_SKIPPING \'%c\'\n",(ulong)uVar14);
    if (uVar16 == 0xd) {
      paVar3->parser_state = 'd';
    }
    else if (uVar16 == 10) goto LAB_0011d381;
    break;
  case 100:
    _lws_log(0x20,"WSI_TOKEN_SKIPPING_SAW_CR \'%c\'\n",(ulong)uVar14);
    if (paVar3->ues != '\0') goto switchD_0011d64a_caseD_2;
    if (bVar8 != 10) goto LAB_0011d820;
LAB_0011d381:
    paVar3->parser_state = 'a';
    paVar3->unk_pos = 0;
    paVar3->lextable_pos = 0;
    break;
  case 0x65:
    _lws_log(0x20,"WSI_PARSING_COMPLETE \'%c\'\n",(ulong)uVar14);
  }
  goto LAB_0011d827;
  while( true ) {
    uVar11 = (ulong)uVar14;
    uVar9 = uVar9 - 1;
    uVar14 = uVar14 - 1;
    if (paVar3->data[uVar11] == '/') break;
LAB_0011d5c7:
    paVar3->pos = uVar14;
    paVar3->frags[bVar8].len = uVar9;
    if (uVar9 < 2) break;
  }
LAB_0011d5e8:
  iVar10 = issue_char(wsi,'\0');
  if (-1 < iVar10) {
    paVar4 = (wsi->http).ah;
    puVar1 = &paVar4->frags[paVar4->nfrag].len;
    *puVar1 = *puVar1 - 1;
    paVar3->parser_state = '\x0f';
LAB_0011d611:
    bVar8 = paVar3->nfrag + 1;
    paVar3->nfrag = bVar8;
LAB_0011d6b4:
    if (bVar8 != 0x60) {
      paVar3->frags[bVar8].offset = paVar3->pos;
      plVar5 = paVar3->frags + bVar8;
      plVar5->len = 0;
      plVar5->nfrag = '\0';
      plVar5->flags = '\x02';
      bVar6 = paVar3->frag_index[paVar3->parser_state];
      if (paVar3->frag_index[paVar3->parser_state] == 0) {
        paVar3->frag_index[paVar3->parser_state] = bVar8;
        paVar3->hdr_token_idx = (uint)paVar3->parser_state;
      }
      else {
        do {
          bVar12 = bVar6;
          bVar6 = paVar3->frags[bVar12].nfrag;
        } while (bVar6 != 0);
        paVar3->frags[bVar12].nfrag = bVar8;
        iVar10 = issue_char(wsi,' ');
        if (iVar10 < 0) {
          return LPR_FAIL;
        }
      }
LAB_0011d827:
      buf = buf + 1;
      iVar10 = *len;
      if (iVar10 == 0) {
        return LPR_OK;
      }
      goto LAB_0011d0e4;
    }
    _lws_log(2,"More hdr frags than we can deal with\n");
  }
  return LPR_FAIL;
}

Assistant:

lws_parser_return_t LWS_WARN_UNUSED_RESULT
lws_parse(struct lws *wsi, unsigned char *buf, int *len)
{
	struct allocated_headers *ah = wsi->http.ah;
	struct lws_context *context = wsi->a.context;
	unsigned int n, m;
	unsigned char c;
	int r, pos;

	assert(wsi->http.ah);

	do {
		(*len)--;
		c = *buf++;

		switch (ah->parser_state) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
		case WSI_TOKEN_UNKNOWN_VALUE_PART:

			if (c == '\r')
				break;
			if (c == '\n') {
				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos + 2],
					       (uint16_t)(ah->pos - ah->unk_value_pos));
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
				break;
			}

			/* trim leading whitespace */
			if (ah->pos != ah->unk_value_pos ||
			    (c != ' ' && c != '\t')) {

				if (lws_pos_in_bounds(wsi))
					return LPR_FAIL;

				ah->data[ah->pos++] = (char)c;
			}
			pos = ah->lextable_pos;
			break;
#endif
		default:

			lwsl_parser("WSI_TOK_(%d) '%c'\n", ah->parser_state, c);

			/* collect into malloc'd buffers */
			/* optional initial space swallow */
			if (!ah->frags[ah->frag_index[ah->parser_state]].len &&
			    c == ' ')
				break;

			for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
				if (ah->parser_state == methods[m])
					break;
			if (m == LWS_ARRAY_SIZE(methods))
				/* it was not any of the methods */
				goto check_eol;

			/* special URI processing... end at space */

			if (c == ' ') {
				/* enforce starting with / */
				if (!ah->frags[ah->nfrag].len)
					if (issue_char(wsi, '/') < 0)
						return LPR_FAIL;

				if (ah->ups == URIPS_SEEN_SLASH_DOT_DOT) {
					/*
					 * back up one dir level if possible
					 * safe against header fragmentation
					 * because the method URI can only be
					 * in 1 fragment
					 */
					if (ah->frags[ah->nfrag].len > 2) {
						ah->pos--;
						ah->frags[ah->nfrag].len--;
						do {
							ah->pos--;
							ah->frags[ah->nfrag].len--;
						} while (ah->frags[ah->nfrag].len > 1 &&
							 ah->data[ah->pos] != '/');
					}
				}

				/* begin parsing HTTP version: */
				if (issue_char(wsi, '\0') < 0)
					return LPR_FAIL;
				/* don't account for it */
				wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
				ah->parser_state = WSI_TOKEN_HTTP;
				goto start_fragment;
			}

			r = lws_parse_urldecode(wsi, &c);
			switch (r) {
			case LPUR_CONTINUE:
				break;
			case LPUR_SWALLOW:
				goto swallow;
			case LPUR_FORBID:
				goto forbid;
			case LPUR_EXCESSIVE:
				goto excessive;
			default:
				return LPR_FAIL;
			}
check_eol:
			/* bail at EOL */
			if (ah->parser_state != WSI_TOKEN_CHALLENGE &&
			    (c == '\x0d' || c == '\x0a')) {
				if (ah->ues != URIES_IDLE)
					goto forbid;

				if (c == '\x0a') {
					/* broken peer */
					ah->parser_state = WSI_TOKEN_NAME_PART;
					ah->unk_pos = 0;
					ah->lextable_pos = 0;
				} else
					ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;

				c = '\0';
				lwsl_parser("*\n");
			}

			n = (unsigned int)issue_char(wsi, c);
			if ((int)n < 0)
				return LPR_FAIL;
			if (n > 0)
				ah->parser_state = WSI_TOKEN_SKIPPING;
			else {
				/*
				 * Explicit zeroes are legal in URI ARGS.
				 * They can only exist as a safety terminator
				 * after the valid part of the token contents
				 * for other types.
				 */
				if (!c && ah->parser_state != WSI_TOKEN_HTTP_URI_ARGS)
					/* don't account for safety terminator */
					wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
			}

swallow:
			/* per-protocol end of headers management */

			if (ah->parser_state == WSI_TOKEN_CHALLENGE)
				goto set_parsing_complete;
			break;

			/* collecting and checking a name part */
		case WSI_TOKEN_NAME_PART:
			lwsl_parser("WSI_TOKEN_NAME_PART '%c' 0x%02X "
				    "(role=0x%lx) "
				    "wsi->lextable_pos=%d\n", c, c,
				    (unsigned long)lwsi_role(wsi),
				    ah->lextable_pos);

			if (!ah->unk_pos && c == '\x0a')
				/* broken peer */
				goto set_parsing_complete;

			if (c >= 'A' && c <= 'Z')
				c = (unsigned char)(c + 'a' - 'A');
			/*
			 * ...in case it's an unknown header, speculatively
			 * store it as the name comes in.  If we recognize it as
			 * a known header, we'll snip this.
			 */

			if (!wsi->mux_substream && !ah->unk_pos) {
				ah->unk_pos = ah->pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
				/*
				 * Prepare new unknown header linked-list entry
				 *
				 *  - 16-bit BE: name part length
				 *  - 16-bit BE: value part length
				 *  - 32-bit BE: data offset of next, or 0
				 */
				for (n = 0; n < 8; n++)
					if (!lws_pos_in_bounds(wsi))
						ah->data[ah->pos++] = 0;
#endif
			}

			if (lws_pos_in_bounds(wsi))
				return LPR_FAIL;

			ah->data[ah->pos++] = (char)c;
			pos = ah->lextable_pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
			if (!wsi->mux_substream && pos < 0 && c == ':') {
#if defined(_DEBUG)
				char dotstar[64];
				int uhlen;
#endif

				/*
				 * process unknown headers
				 *
				 * register us in the unknown hdr ll
				 */

				if (!ah->unk_ll_head)
					ah->unk_ll_head = ah->unk_pos;

				if (ah->unk_ll_tail)
					lws_ser_wu32be(
				(uint8_t *)&ah->data[ah->unk_ll_tail + UHO_LL],
						       ah->unk_pos);

				ah->unk_ll_tail = ah->unk_pos;

#if defined(_DEBUG)
				uhlen = (int)(ah->pos - (ah->unk_pos + UHO_NAME));
				lws_strnncpy(dotstar,
					&ah->data[ah->unk_pos + UHO_NAME],
					uhlen, sizeof(dotstar));
				lwsl_debug("%s: unk header %d '%s'\n",
					    __func__,
					    ah->pos - (ah->unk_pos + UHO_NAME),
					    dotstar);
#endif

				/* set the unknown header name part length */

				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos],
					       (uint16_t)((ah->pos - ah->unk_pos) - UHO_NAME));

				ah->unk_value_pos = ah->pos;

				/*
				 * collect whatever's coming for the unknown header
				 * argument until the next CRLF
				 */
				ah->parser_state = WSI_TOKEN_UNKNOWN_VALUE_PART;
				break;
			}
#endif
			if (pos < 0)
				break;

			while (1) {
				if (lextable_h1[pos] & (1 << 7)) {
					/* 1-byte, fail on mismatch */
					if ((lextable_h1[pos] & 0x7f) != c) {
nope:
						ah->lextable_pos = -1;
						break;
					}
					/* fall thru */
					pos++;
					if (lextable_h1[pos] == FAIL_CHAR)
						goto nope;

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == FAIL_CHAR)
					goto nope;

				/* b7 = 0, end or 3-byte */
				if (lextable_h1[pos] < FAIL_CHAR) {
					if (!wsi->mux_substream) {
						/*
						 * We hit a terminal marker, so
						 * we recognized this header...
						 * drop the speculative name
						 * part storage
						 */
						ah->pos = ah->unk_pos;
						ah->unk_pos = 0;
					}

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == c) { /* goto */
					ah->lextable_pos = (int16_t)(pos +
						(lextable_h1[pos + 1]) +
						(lextable_h1[pos + 2] << 8));
					break;
				}

				/* fall thru goto */
				pos += 3;
				/* continue */
			}

			/*
			 * If it's h1, server needs to be on the look out for
			 * unknown methods...
			 */
			if (ah->lextable_pos < 0 && lwsi_role_h1(wsi) &&
			    lwsi_role_server(wsi)) {
				/*
				 * this is not a header we know about... did
				 * we get a valid method (GET, POST etc)
				 * already, or is this the bogus method?
				 */
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (ah->frag_index[methods[m]]) {
						/*
						 * already had the method
						 */
#if !defined(LWS_WITH_CUSTOM_HEADERS)
						ah->parser_state = WSI_TOKEN_SKIPPING;
#endif
						if (wsi->mux_substream)
							ah->parser_state = WSI_TOKEN_SKIPPING;
						break;
					}

				if (m != LWS_ARRAY_SIZE(methods)) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
					/*
					 * We have the method, this is just an
					 * unknown header then
					 */
					if (!wsi->mux_substream)
						goto unknown_hdr;
					else
						break;
#else
					break;
#endif
				}
				/*
				 * ...it's an unknown http method from a client
				 * in fact, it cannot be valid http.
				 *
				 * Are we set up to transition to another role
				 * in these cases?
				 */
				if (lws_check_opt(wsi->a.vhost->options,
		    LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_ACCEPT_CONFIG)) {
					lwsl_notice("%s: http fail fallback\n",
						    __func__);
					 /* transition to other role */
					return LPR_DO_FALLBACK;
				}

				lwsl_info("Unknown method - dropping\n");
				goto forbid;
			}
			if (ah->lextable_pos < 0) {
				/*
				 * It's not a header that lws knows about...
				 */
#if defined(LWS_WITH_CUSTOM_HEADERS)
				if (!wsi->mux_substream)
					goto unknown_hdr;
#endif
				/*
				 * ...otherwise for a client, let him ignore
				 * unknown headers coming from the server
				 */
				ah->parser_state = WSI_TOKEN_SKIPPING;
				break;
			}

			if (lextable_h1[ah->lextable_pos] < FAIL_CHAR) {
				/* terminal state */

				n = ((unsigned int)lextable_h1[ah->lextable_pos] << 8) |
						lextable_h1[ah->lextable_pos + 1];

				lwsl_parser("known hdr %d\n", n);
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (n == methods[m] &&
					    ah->frag_index[methods[m]]) {
						lwsl_warn("Duplicated method\n");
						return LPR_FAIL;
					}

				if (!wsi->mux_substream) {
					/*
					 * Whether we are collecting unknown names or not,
					 * if we matched an internal header we can dispense
					 * with the header name part we were keeping
					 */
					ah->pos = ah->unk_pos;
					ah->unk_pos = 0;
				}

#if defined(LWS_ROLE_WS)
				/*
				 * WSORIGIN is protocol equiv to ORIGIN,
				 * JWebSocket likes to send it, map to ORIGIN
				 */
				if (n == WSI_TOKEN_SWORIGIN)
					n = WSI_TOKEN_ORIGIN;
#endif

				ah->parser_state = (uint8_t)
							(WSI_TOKEN_GET_URI + n);
				ah->ups = URIPS_IDLE;

				if (context->token_limits)
					ah->current_token_limit = context->
						token_limits->token_limit[
							      ah->parser_state];
				else
					ah->current_token_limit =
						wsi->a.context->max_http_header_data;

				if (ah->parser_state == WSI_TOKEN_CHALLENGE)
					goto set_parsing_complete;

				goto start_fragment;
			}
			break;

#if defined(LWS_WITH_CUSTOM_HEADERS)
unknown_hdr:
			//ah->parser_state = WSI_TOKEN_SKIPPING;
			//break;
			if (!wsi->mux_substream)
				break;
#endif

start_fragment:
			ah->nfrag++;
excessive:
			if (ah->nfrag == LWS_ARRAY_SIZE(ah->frags)) {
				lwsl_warn("More hdr frags than we can deal with\n");
				return LPR_FAIL;
			}

			ah->frags[ah->nfrag].offset = ah->pos;
			ah->frags[ah->nfrag].len = 0;
			ah->frags[ah->nfrag].nfrag = 0;
			ah->frags[ah->nfrag].flags = 2;

			n = ah->frag_index[ah->parser_state];
			if (!n) { /* first fragment */
				ah->frag_index[ah->parser_state] = ah->nfrag;
				ah->hdr_token_idx = ah->parser_state;
				break;
			}
			/* continuation */
			while (ah->frags[n].nfrag)
				n = ah->frags[n].nfrag;
			ah->frags[n].nfrag = ah->nfrag;

			if (issue_char(wsi, ' ') < 0)
				return LPR_FAIL;
			break;

			/* skipping arg part of a name we didn't recognize */
		case WSI_TOKEN_SKIPPING:
			lwsl_parser("WSI_TOKEN_SKIPPING '%c'\n", c);

			if (c == '\x0a') {
				/* broken peer */
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			}

			if (c == '\x0d')
				ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;
			break;

		case WSI_TOKEN_SKIPPING_SAW_CR:
			lwsl_parser("WSI_TOKEN_SKIPPING_SAW_CR '%c'\n", c);
			if (ah->ues != URIES_IDLE)
				goto forbid;
			if (c == '\x0a') {
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			} else
				ah->parser_state = WSI_TOKEN_SKIPPING;
			break;
			/* we're done, ignore anything else */

		case WSI_PARSING_COMPLETE:
			lwsl_parser("WSI_PARSING_COMPLETE '%c'\n", c);
			break;
		}

	} while (*len);

	return LPR_OK;

set_parsing_complete:
	if (ah->ues != URIES_IDLE)
		goto forbid;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_UPGRADE)) {
#if defined(LWS_ROLE_WS)
		const char *pv = lws_hdr_simple_ptr(wsi, WSI_TOKEN_VERSION);
		if (pv)
			wsi->rx_frame_type = (char)atoi(pv);

		lwsl_parser("v%02d hdrs done\n", wsi->rx_frame_type);
#endif
	}
	ah->parser_state = WSI_PARSING_COMPLETE;
	wsi->hdr_parsing_completed = 1;

	return LPR_OK;

forbid:
	lwsl_info(" forbidding on uri sanitation\n");
#if defined(LWS_WITH_SERVER)
	lws_return_http_status(wsi, HTTP_STATUS_FORBIDDEN, NULL);
#endif

	return LPR_FORBIDDEN;
}